

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void cimg_library::CImgDisplay::_render_resize<unsigned_int,unsigned_int>
               (uint *ptrs,uint ws,uint hs,uint *ptrd,uint wd,uint hd)

{
  void *pvVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar8 = (ulong)wd;
  pvVar1 = operator_new__(uVar8 * 4);
  puVar2 = (uint *)operator_new__((ulong)(hd + 1) << 2);
  fVar9 = 0.0;
  for (lVar5 = 0; wd != (uint)lVar5; lVar5 = lVar5 + 1) {
    fVar10 = (float)ws / (float)uVar8 + fVar9;
    *(int *)((long)pvVar1 + lVar5 * 4) = (int)(long)fVar10 - (int)(long)fVar9;
    fVar9 = fVar10;
  }
  fVar9 = 0.0;
  for (lVar5 = 0; hd != (uint)lVar5; lVar5 = lVar5 + 1) {
    fVar10 = (float)hs / (float)hd + fVar9;
    puVar2[lVar5] = ((int)(long)fVar10 - (int)(long)fVar9) * ws;
    fVar9 = fVar10;
  }
  puVar2[lVar5] = 0;
  uVar4 = 0;
  puVar6 = puVar2;
  while (uVar4 < hd) {
    puVar3 = ptrs;
    for (lVar5 = 0; puVar7 = puVar6, wd != (uint)lVar5; lVar5 = lVar5 + 1) {
      *ptrd = *puVar3;
      ptrd = ptrd + 1;
      puVar3 = puVar3 + *(uint *)((long)pvVar1 + lVar5 * 4);
    }
    while( true ) {
      uVar4 = uVar4 + 1;
      puVar6 = puVar7 + 1;
      if (((ulong)*puVar7 != 0) || (hd <= uVar4)) break;
      memcpy(ptrd,ptrd + -uVar8,uVar8 * 4);
      ptrd = ptrd + uVar8;
      puVar7 = puVar6;
    }
    ptrs = ptrs + *puVar7;
  }
  operator_delete__(pvVar1);
  operator_delete__(puVar2);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      unsigned int *const offx = new unsigned int[wd], *const offy = new unsigned int[hd+1], *poffx, *poffy;
      float s, curr, old;
      s = (float)ws/wd;
      poffx = offx; curr = 0; for (unsigned int x = 0; x<wd; ++x) { old = curr; curr+=s; *(poffx++) = (unsigned int)curr - (unsigned int)old; }
      s = (float)hs/hd;
      poffy = offy; curr = 0; for (unsigned int y = 0; y<hd; ++y) { old = curr; curr+=s; *(poffy++) = ws*((unsigned int)curr - (unsigned int)old); }
      *poffy = 0;
      poffy = offy;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        poffx = offx;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poffx++); }
        ++y;
        unsigned int dy = *(poffy++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poffy++)) {}
        ptrs+=dy;
      }
      delete[] offx; delete[] offy;
    }